

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O1

CrcCordState * __thiscall
absl::lts_20250127::crc_internal::CrcCordState::operator=(CrcCordState *this,CrcCordState *other)

{
  RefcountedRep *pRVar1;
  
  if (this != other) {
    Unref(this->refcounted_rep_);
    pRVar1 = other->refcounted_rep_;
    this->refcounted_rep_ = pRVar1;
    if (pRVar1 == (RefcountedRep *)0x0) {
      __assert_fail("r != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/crc/internal/crc_cord_state.h"
                    ,0x8d,"static void absl::crc_internal::CrcCordState::Ref(RefcountedRep *)");
    }
    LOCK();
    (pRVar1->count).super___atomic_base<int>._M_i =
         (pRVar1->count).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return this;
}

Assistant:

CrcCordState& CrcCordState::operator=(const CrcCordState& other) {
  if (this != &other) {
    Unref(refcounted_rep_);
    refcounted_rep_ = other.refcounted_rep_;
    Ref(refcounted_rep_);
  }
  return *this;
}